

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

Transform * __thiscall
sf::Transform::scale(Transform *this,float scaleX,float scaleY,float centerX,float centerY)

{
  Transform local_48;
  
  local_48.m_matrix[0xc] = centerX * (1.0 - scaleX);
  local_48.m_matrix[0xd] = centerY * (1.0 - scaleY);
  local_48.m_matrix[1] = 0.0;
  local_48.m_matrix[2] = 0.0;
  local_48.m_matrix[3] = 0.0;
  local_48.m_matrix[4] = 0.0;
  local_48.m_matrix[6] = 0.0;
  local_48.m_matrix[7] = 0.0;
  local_48.m_matrix[8] = 0.0;
  local_48.m_matrix[9] = 0.0;
  local_48.m_matrix[10] = 1.0;
  local_48.m_matrix[0xb] = 0.0;
  local_48.m_matrix[0xe] = 0.0;
  local_48.m_matrix[0xf] = 1.0;
  local_48.m_matrix[0] = scaleX;
  local_48.m_matrix[5] = scaleY;
  combine(this,&local_48);
  return this;
}

Assistant:

Transform& Transform::scale(float scaleX, float scaleY, float centerX, float centerY)
{
    Transform scaling(scaleX, 0,      centerX * (1 - scaleX),
                      0,      scaleY, centerY * (1 - scaleY),
                      0,      0,      1);

    return combine(scaling);
}